

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifMan.c
# Opt level: O2

If_Obj_t * If_ManCreateCo(If_Man_t *p,If_Obj_t *pDriver)

{
  uint uVar1;
  Vec_Ptr_t *p_00;
  uint uVar2;
  uint uVar3;
  If_Obj_t *Entry;
  If_Obj_t *pIVar4;
  
  Entry = If_ManSetupObj(p);
  p_00 = p->vCos;
  Entry->IdPio = p_00->nSize;
  Vec_PtrPush(p_00,Entry);
  *(uint *)Entry = (*(uint *)Entry & 0xffffffe0) + ((uint)pDriver & 1) * 0x10 + 3;
  pIVar4 = (If_Obj_t *)((ulong)pDriver & 0xfffffffffffffffe);
  Entry->pFanin0 = pIVar4;
  pIVar4->nRefs = pIVar4->nRefs + 1;
  uVar1 = *(uint *)Entry;
  uVar2 = (uVar1 * 4 ^ *(uint *)pIVar4) & 0x40;
  *(uint *)Entry = uVar1 & 0xffffffbf | uVar2;
  uVar3 = *(uint *)pIVar4;
  *(uint *)Entry = uVar1 & 0x1fbf | uVar2 | uVar3 & 0xffffe000;
  uVar3 = uVar3 >> 0xd;
  if (p->nLevelMax < (int)uVar3) {
    p->nLevelMax = uVar3;
  }
  p->nObjs[3] = p->nObjs[3] + 1;
  return Entry;
}

Assistant:

If_Obj_t * If_ManCreateCo( If_Man_t * p, If_Obj_t * pDriver )
{
    If_Obj_t * pObj;
    pObj = If_ManSetupObj( p );
    pObj->IdPio = Vec_PtrSize( p->vCos );
    Vec_PtrPush( p->vCos, pObj );
    pObj->Type = IF_CO;
    pObj->fCompl0 = If_IsComplement(pDriver); pDriver = If_Regular(pDriver);
    pObj->pFanin0 = pDriver; pDriver->nRefs++; 
    pObj->fPhase  = (pObj->fCompl0 ^ pDriver->fPhase);
    pObj->Level   = pDriver->Level;
    if ( p->nLevelMax < (int)pObj->Level )
        p->nLevelMax = (int)pObj->Level;
    p->nObjs[IF_CO]++;
    return pObj;
}